

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O3

void cuddShrinkDeathRow(DdManager *table)

{
  DdNode *n;
  ulong uVar1;
  uint uVar2;
  DdNode **ppDVar3;
  int iVar4;
  ulong uVar6;
  uint uVar5;
  
  uVar2 = table->deathRowDepth;
  if (3 < (int)uVar2) {
    n = table->deathRow[uVar2 >> 2];
    uVar1 = (ulong)(uVar2 >> 2);
    while (n != (DdNode *)0x0) {
      uVar6 = uVar1 + 1;
      Cudd_IterDerefBdd(table,n);
      table->deathRow[uVar1] = (DdNode *)0x0;
      uVar2 = table->deathRowDepth;
      if ((long)(int)uVar2 <= (long)uVar6) break;
      uVar1 = uVar6;
      n = table->deathRow[uVar6];
    }
    uVar5 = uVar2 + 3;
    if (-1 < (int)uVar2) {
      uVar5 = uVar2;
    }
    iVar4 = (int)uVar5 >> 2;
    table->deathRowDepth = iVar4;
    table->deadMask = iVar4 - 1U;
    if (iVar4 - 1U < (uint)table->nextDead) {
      table->nextDead = 0;
    }
    if (table->deathRow == (DdNode **)0x0) {
      ppDVar3 = (DdNode **)malloc((long)iVar4 << 3);
    }
    else {
      ppDVar3 = (DdNode **)realloc(table->deathRow,(long)iVar4 << 3);
    }
    table->deathRow = ppDVar3;
  }
  return;
}

Assistant:

void
cuddShrinkDeathRow(
  DdManager *table)
{
#ifndef DD_NO_DEATH_ROW
    int i;

    if (table->deathRowDepth > 3) {
        for (i = table->deathRowDepth/4; i < table->deathRowDepth; i++) {
            if (table->deathRow[i] == NULL) break;
            Cudd_IterDerefBdd(table,table->deathRow[i]);
            table->deathRow[i] = NULL;
        }
        table->deathRowDepth /= 4;
        table->deadMask = table->deathRowDepth - 1;
        if ((unsigned) table->nextDead > table->deadMask) {
            table->nextDead = 0;
        }
        table->deathRow = ABC_REALLOC(DdNodePtr, table->deathRow,
                                   table->deathRowDepth);
    }
#endif

}